

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

void lanli_escape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    if (uVar4 < size) {
      bVar5 = true;
      uVar2 = uVar4;
      if (""[data[uVar4]] == '\0') {
        do {
          uVar3 = size;
          if (size - 1 == uVar2) goto LAB_00122df9;
          lVar1 = uVar2 + 1;
          uVar2 = uVar2 + 1;
        } while (""[data[lVar1]] == '\0');
        bVar5 = uVar2 < size;
        uVar3 = uVar2;
      }
    }
    else {
LAB_00122df9:
      if (uVar4 == 0) {
        lanli_buffer_put(ob,data,size);
        return;
      }
      bVar5 = false;
    }
    if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
      lanli_buffer_put(ob,data + uVar4,uVar3 - uVar4);
    }
    if (!bVar5) {
      return;
    }
    lanli_buffer_puts(ob,HTML_ESCAPES_rel + *(int *)(HTML_ESCAPES_rel + (ulong)""[data[uVar3]] * 4))
    ;
    uVar4 = uVar3 + 1;
  } while( true );
}

Assistant:

void lanli_escape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && HTML_ESCAPE_TABLE[data[i]] == 0) i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    lanli_buffer_puts(ob, HTML_ESCAPES[HTML_ESCAPE_TABLE[data[i]]]);
    i++;
  }
}